

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_mrihtol.c
# Opt level: O0

int SUNAdaptController_SetDefaults_MRIHTol(SUNAdaptController C)

{
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  
  SUNAdaptController_SetDefaults(*(undefined8 *)*in_RDI);
  SUNAdaptController_SetDefaults(*(undefined8 *)(*in_RDI + 8));
  *(undefined8 *)(*in_RDI + 0x10) = 0x4034000000000000;
  *(undefined8 *)(*in_RDI + 0x18) = 0x3ee4f8b588e368f1;
  *(undefined8 *)(*in_RDI + 0x20) = 0x3ff0000000000000;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetDefaults_MRIHTol(SUNAdaptController C)
{
  SUNFunctionBegin(C->sunctx);
  SUNCheckCall(SUNAdaptController_SetDefaults(MRIHTOL_CSLOW(C)));
  SUNCheckCall(SUNAdaptController_SetDefaults(MRIHTOL_CFAST(C)));
  MRIHTOL_INNER_MAX_RELCH(C)  = INNER_MAX_RELCH;
  MRIHTOL_INNER_MIN_TOLFAC(C) = INNER_MIN_TOLFAC;
  MRIHTOL_INNER_MAX_TOLFAC(C) = INNER_MAX_TOLFAC;
  return SUN_SUCCESS;
}